

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void save_stack_buffer(stCoRoutine_t *occupy_co)

{
  char *pcVar1;
  char *pcVar2;
  char *__src;
  uint uVar3;
  
  pcVar2 = occupy_co->stack_sp;
  pcVar1 = occupy_co->stack_mem->stack_bp;
  __src = pcVar2;
  if (occupy_co->save_buffer != (char *)0x0) {
    free(occupy_co->save_buffer);
    __src = occupy_co->stack_sp;
  }
  uVar3 = (int)pcVar1 - (int)pcVar2;
  pcVar2 = (char *)malloc((long)(int)uVar3);
  occupy_co->save_buffer = pcVar2;
  occupy_co->save_size = uVar3;
  memcpy(pcVar2,__src,(long)(int)uVar3);
  return;
}

Assistant:

void save_stack_buffer(stCoRoutine_t* occupy_co)
{
	///copy out
	stStackMem_t* stack_mem = occupy_co->stack_mem;
	int len = stack_mem->stack_bp - occupy_co->stack_sp;

	if (occupy_co->save_buffer)
	{
		free(occupy_co->save_buffer), occupy_co->save_buffer = NULL;
	}

	occupy_co->save_buffer = (char*)malloc(len); //malloc buf;
	occupy_co->save_size = len;

	memcpy(occupy_co->save_buffer, occupy_co->stack_sp, len);
}